

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

QMessageLogContext * __thiscall
QMessageLogContext::copyContextFrom(QMessageLogContext *this,QMessageLogContext *logContext)

{
  QInternalMessageLogContext *in_RSI;
  QMessageLogContext *in_RDI;
  
  in_RDI->category = (in_RSI->super_QMessageLogContext).category;
  in_RDI->file = (in_RSI->super_QMessageLogContext).file;
  in_RDI->line = (in_RSI->super_QMessageLogContext).line;
  in_RDI->function = (in_RSI->super_QMessageLogContext).function;
  if (in_RDI->version == 3) {
    copyInternalContext(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

QMessageLogContext &QMessageLogContext::copyContextFrom(const QMessageLogContext &logContext) noexcept
{
    this->category = logContext.category;
    this->file = logContext.file;
    this->line = logContext.line;
    this->function = logContext.function;
    if (Q_UNLIKELY(version == CurrentVersion + 1))
        copyInternalContext(static_cast<QInternalMessageLogContext *>(this), logContext);
    return *this;
}